

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

CURLcode cf_socket_open(Curl_cfilter *cf,Curl_easy *data)

{
  Curl_sockaddr_ex *addr;
  uint *sockfd;
  undefined1 *puVar1;
  uchar uVar2;
  void *pvVar3;
  void *pvVar4;
  connectdata *pcVar5;
  bool bVar6;
  _Bool _Var7;
  uchar uVar8;
  if2ip_result_t iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  if2ip_result_t iVar14;
  resolve_t rVar15;
  int *piVar16;
  ulong uVar17;
  uint *puVar18;
  curl_trc_feat *pcVar19;
  size_t sVar20;
  socklen_t __len;
  char *__s;
  char *pcVar21;
  char *pcVar22;
  ushort uVar23;
  bool bVar24;
  curltime cVar25;
  uint local_2f8;
  char *local_2e8;
  Curl_dns_entry *h;
  uint local_2c8;
  int on;
  curl_off_t scope_id;
  Curl_sockaddr_storage sa;
  char myhost [256];
  curl_socklen_t onoff;
  undefined4 uStack_134;
  
  pvVar3 = cf->ctx;
  cVar25 = Curl_now();
  *(time_t *)((long)pvVar3 + 0x100) = cVar25.tv_sec;
  *(int *)((long)pvVar3 + 0x108) = cVar25.tv_usec;
  if ((data->set).fopensocket == (curl_opensocket_callback)0x0) {
    *(byte *)((long)pvVar3 + 0xd) = *(byte *)((long)pvVar3 + 0xd) | 8;
  }
  addr = (Curl_sockaddr_ex *)((long)pvVar3 + 8);
  sockfd = (uint *)((long)pvVar3 + 0x98);
  iVar9 = socket_open(data,addr,(curl_socket_t *)sockfd);
  if ((data->set).fopensocket == (curl_opensocket_callback)0x0) {
    *(byte *)((long)pvVar3 + 0xd) = *(byte *)((long)pvVar3 + 0xd) & 0xf7;
  }
  if (iVar9 == IF2IP_NOT_FOUND) {
    pvVar4 = cf->ctx;
    _Var7 = Curl_addr2string((sockaddr *)((long)pvVar4 + 0x18),
                             *(curl_socklen_t *)((long)pvVar4 + 0x14),(char *)((long)pvVar4 + 0x9c),
                             (int *)((long)pvVar4 + 0xf8));
    if (_Var7) {
      uVar10 = (uint)*(undefined8 *)&(data->set).field_0x894;
      if (addr->family == 10) {
        if ((uVar10 >> 0x1e & 1) != 0) {
          pcVar19 = (data->state).feat;
          pcVar21 = "  Trying [%s]:%d...";
LAB_00117219:
          if ((pcVar19 == (curl_trc_feat *)0x0) || (0 < pcVar19->log_level)) {
            Curl_infof(data,pcVar21,(long)pvVar3 + 0x9c,(ulong)*(uint *)((long)pvVar3 + 0xf8));
          }
        }
      }
      else if ((uVar10 >> 0x1e & 1) != 0) {
        pcVar19 = (data->state).feat;
        pcVar21 = "  Trying %s:%d...";
        goto LAB_00117219;
      }
      if (((addr->family | 8U) == 10) && (*(int *)((long)pvVar3 + 0xc) == 1)) {
        uVar17 = *(ulong *)&(data->set).field_0x894;
        if ((uVar17 >> 0x22 & 1) != 0) {
          _onoff = (char *)CONCAT44(uStack_134,1);
          iVar11 = setsockopt(*sockfd,6,1,&onoff,4);
          uVar17 = *(ulong *)&(data->set).field_0x894;
          if ((((uint)uVar17 >> 0x1e & 1) != 0 && iVar11 < 0) &&
             ((pcVar19 = (data->state).feat, pcVar19 == (curl_trc_feat *)0x0 ||
              (0 < pcVar19->log_level)))) {
            piVar16 = __errno_location();
            pcVar21 = Curl_strerror(*piVar16,myhost,0x100);
            Curl_infof(data,"Could not set TCP_NODELAY: %s",pcVar21);
            uVar17 = *(ulong *)&(data->set).field_0x894;
          }
        }
        if ((uVar17 >> 0x28 & 1) != 0) {
          uVar10 = *sockfd;
          uVar17 = (ulong)uVar10;
          myhost[0] = '\x01';
          myhost[1] = '\0';
          myhost[2] = '\0';
          myhost[3] = '\0';
          iVar11 = setsockopt(uVar10,1,9,myhost,4);
          if (iVar11 < 0) {
            if (((data->set).field_0x897 & 0x40) != 0) {
              pcVar19 = (data->state).feat;
              pcVar21 = "Failed to set SO_KEEPALIVE on fd %d: errno %d";
              goto LAB_00117434;
            }
          }
          else {
            myhost._0_4_ = curlx_sltosi((long)(data->set).tcp_keepidle);
            iVar11 = setsockopt(uVar10,6,4,myhost,4);
            if (((iVar11 < 0) && (((data->set).field_0x897 & 0x40) != 0)) &&
               ((pcVar19 = (data->state).feat, pcVar19 == (curl_trc_feat *)0x0 ||
                (0 < pcVar19->log_level)))) {
              puVar18 = (uint *)__errno_location();
              Curl_infof(data,"Failed to set TCP_KEEPIDLE on fd %d: errno %d",uVar17,(ulong)*puVar18
                        );
            }
            myhost._0_4_ = curlx_sltosi((long)(data->set).tcp_keepintvl);
            iVar11 = setsockopt(uVar10,6,5,myhost,4);
            if (((iVar11 < 0) && (((data->set).field_0x897 & 0x40) != 0)) &&
               ((pcVar19 = (data->state).feat, pcVar19 == (curl_trc_feat *)0x0 ||
                (0 < pcVar19->log_level)))) {
              puVar18 = (uint *)__errno_location();
              Curl_infof(data,"Failed to set TCP_KEEPINTVL on fd %d: errno %d",uVar17,
                         (ulong)*puVar18);
            }
            myhost._0_4_ = curlx_sltosi((long)(data->set).tcp_keepcnt);
            iVar11 = setsockopt(uVar10,6,6,myhost,4);
            if ((iVar11 < 0) && (((data->set).field_0x897 & 0x40) != 0)) {
              pcVar19 = (data->state).feat;
              pcVar21 = "Failed to set TCP_KEEPCNT on fd %d: errno %d";
LAB_00117434:
              if ((pcVar19 == (curl_trc_feat *)0x0) || (0 < pcVar19->log_level)) {
                puVar18 = (uint *)__errno_location();
                Curl_infof(data,pcVar21,uVar17,(ulong)*puVar18);
              }
            }
          }
        }
      }
      if ((data->set).fsockopt == (curl_sockopt_callback)0x0) {
LAB_0011749d:
        bVar6 = false;
      }
      else {
        Curl_set_in_callback(data,true);
        iVar11 = (*(data->set).fsockopt)((data->set).sockopt_client,*sockfd,CURLSOCKTYPE_IPCXN);
        Curl_set_in_callback(data,false);
        if (iVar11 != 2) {
          if (iVar11 != 0) {
            iVar9 = 0x2a;
            goto LAB_00117187;
          }
          goto LAB_0011749d;
        }
        bVar6 = true;
      }
      uVar10 = addr->family;
      if ((uVar10 | 8) == 10) {
        pcVar5 = cf->conn;
        iVar11 = *(int *)((long)pvVar3 + 0x98);
        uVar12 = Curl_ipv6_scope((sockaddr *)((long)pvVar3 + 0x18));
        h = (Curl_dns_entry *)0x0;
        uVar23 = (data->set).localport;
        pcVar21 = (data->set).str[0x1e];
        local_2e8 = (data->set).str[0x1f];
        pcVar22 = (data->set).str[0x20];
        __s = local_2e8;
        if (local_2e8 == (char *)0x0) {
          __s = pcVar21;
        }
        on = 1;
        if (uVar23 != 0 ||
            ((__s != (char *)0x0 || pcVar22 != (char *)0x0) || pcVar21 != (char *)0x0)) {
          local_2f8 = (uint)(data->set).localportrange;
          local_2c8 = uVar12;
          if ((__s == (char *)0x0) || (sVar20 = strlen(__s), sVar20 < 0xff)) {
            sa.buffer._112_8_ = 0;
            sa.buffer.sa_stor.__ss_align = 0;
            sa.buffer._96_8_ = 0;
            sa.buffer._104_8_ = 0;
            sa.buffer._80_8_ = 0;
            sa.buffer._88_8_ = 0;
            sa.buffer._64_8_ = 0;
            sa.buffer._72_8_ = 0;
            sa.buffer._48_8_ = 0;
            sa.buffer._56_8_ = 0;
            sa.buffer._32_8_ = 0;
            sa.buffer._40_8_ = 0;
            sa.buffer._16_8_ = 0;
            sa.buffer._24_8_ = 0;
            sa.buffer._0_8_ = 0;
            sa.buffer._8_1_ = '\0';
            sa.buffer._9_1_ = '\0';
            sa.buffer._10_1_ = '\0';
            sa.buffer._11_1_ = '\0';
            sa.buffer._12_1_ = '\0';
            sa.buffer._13_1_ = '\0';
            sa.buffer._14_1_ = '\0';
            sa.buffer._15_1_ = '\0';
            if ((__s == (char *)0x0 && pcVar22 == (char *)0x0) && pcVar21 == (char *)0x0) {
              if (uVar10 == 2) {
                __len = 0x10;
                sa.buffer.sa.sa_family = 2;
              }
              else {
                __len = 0;
                if (uVar10 != 10) goto LAB_00117685;
                __len = 0x1c;
                sa.buffer.sa.sa_family = 10;
              }
              sa.buffer.sa_in.sin_port = uVar23 << 8 | uVar23 >> 8;
              sa.buffer.sa_in6.sin6_flowinfo = 0;
LAB_00117685:
              setsockopt(iVar11,0,0x18,&on,4);
              uVar10 = (uint)uVar23;
              while( true ) {
                uVar12 = uVar10 + 1;
                iVar13 = bind(iVar11,(sockaddr *)&sa,__len);
                if (-1 < iVar13) break;
                if (((int)local_2f8 < 2) || (uVar23 = (ushort)uVar12, uVar23 == 0)) {
                  puVar18 = (uint *)__errno_location();
                  uVar10 = *puVar18;
                  (data->state).os_errno = uVar10;
                  pcVar21 = Curl_strerror(uVar10,myhost,0x100);
                  Curl_failf(data,"bind failed with errno %d: %s",(ulong)uVar10,pcVar21);
                  goto LAB_001179e7;
                }
                if ((((data->set).field_0x897 & 0x40) != 0) &&
                   ((pcVar19 = (data->state).feat, pcVar19 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar19->log_level)))) {
                  Curl_infof(data,"Bind to local port %d failed, trying next",
                             (ulong)((uVar12 & 0xffff) - 1));
                }
                sa.buffer.sa_in.sin_port = uVar23 << 8 | uVar23 >> 8;
                local_2f8 = local_2f8 - 1;
                uVar10 = uVar12;
              }
              if ((((data->set).field_0x897 & 0x40) != 0) &&
                 ((pcVar19 = (data->state).feat, pcVar19 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar19->log_level)))) {
                Curl_infof(data,"Local port: %hu",(ulong)uVar10);
              }
              puVar1 = &(pcVar5->bits).field_0x2;
              *puVar1 = *puVar1 | 0x10;
              goto LAB_001177c6;
            }
            memset(myhost,0,0x100);
            if (__s != (char *)0x0) {
              sVar20 = strlen(__s);
              iVar13 = setsockopt(iVar11,1,0x19,__s,(int)sVar20 + 1);
              if (iVar13 == 0 && pcVar22 == (char *)0x0) {
                if ((((data->set).field_0x897 & 0x40) != 0) &&
                   ((pcVar19 = (data->state).feat, pcVar19 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar19->log_level)))) {
                  Curl_infof(data,"socket successfully bound to interface \'%s\'",__s);
                }
                goto LAB_001177c6;
              }
            }
            if (pcVar22 == (char *)0x0) {
              iVar14 = Curl_if2ip(uVar10,local_2c8,pcVar5->scope_id,__s,myhost,0x100);
              if (iVar14 == IF2IP_FOUND) {
                if ((((data->set).field_0x897 & 0x40) != 0) &&
                   ((pcVar19 = (data->state).feat, pcVar19 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar19->log_level)))) {
                  Curl_infof(data,"Local Interface %s is ip %s using address family %i",__s,myhost,
                             (ulong)uVar10);
                }
                pcVar22 = myhost;
                if (local_2e8 == (char *)0x0) goto LAB_0011762f;
LAB_00117a45:
                __len = 0;
                if (uVar10 == 2) {
                  iVar13 = inet_pton(2,myhost,(void *)((long)&sa.buffer + 4));
                  if (0 < iVar13) {
                    sa.buffer.sa_in.sin_port = uVar23 << 8 | uVar23 >> 8;
                    sa.buffer.sa.sa_family = 2;
                    __len = 0x10;
                  }
                }
                else if (uVar10 == 10) {
                  pcVar21 = strchr(myhost,0x25);
                  _onoff = pcVar21;
                  if (pcVar21 != (char *)0x0) {
                    _onoff = pcVar21 + 1;
                    *pcVar21 = '\0';
                  }
                  iVar13 = inet_pton(10,myhost,(void *)((long)&sa.buffer + 8));
                  if (0 < iVar13) {
                    sa.buffer.sa_in.sin_port = uVar23 << 8 | uVar23 >> 8;
                    sa.buffer.sa.sa_family = 10;
                    if (pcVar21 != (char *)0x0) {
                      iVar13 = Curl_str_number((char **)&onoff,&scope_id,0xffffffff);
                      if (iVar13 != 0) goto LAB_00117994;
                      sa.buffer.sa_in6.sin6_scope_id = (undefined4)scope_id;
                    }
                  }
                  __len = 0x1c;
                }
                goto LAB_00117685;
              }
              if (iVar14 == IF2IP_AF_NOT_SUPPORTED) goto LAB_001179ea;
              pcVar22 = pcVar21;
              if (iVar14 != IF2IP_NOT_FOUND) {
                bVar24 = local_2e8 == (char *)0x0;
                local_2e8 = pcVar21;
                if (bVar24) goto LAB_0011762f;
                goto LAB_001179a2;
              }
              if (local_2e8 == (char *)0x0) goto LAB_0011762f;
              puVar18 = (uint *)__errno_location();
              uVar10 = *puVar18;
              (data->state).os_errno = uVar10;
              pcVar21 = Curl_strerror(uVar10,(char *)&onoff,0x100);
              pcVar22 = "Couldn\'t bind to interface \'%s\' with errno %d: %s";
            }
            else {
LAB_0011762f:
              uVar2 = pcVar5->ip_version;
              if (uVar10 == 2) {
                uVar8 = '\x01';
LAB_001178d5:
                pcVar5->ip_version = uVar8;
              }
              else if (uVar10 == 10) {
                uVar8 = '\x02';
                goto LAB_001178d5;
              }
              rVar15 = Curl_resolv(data,pcVar22,0x50,false,&h);
              if (rVar15 == CURLRESOLV_PENDING) {
                Curl_resolver_wait_resolv(data,&h);
              }
              pcVar5->ip_version = uVar2;
              local_2e8 = pcVar22;
              if (h != (Curl_dns_entry *)0x0) {
                uVar12 = h->addr->ai_family;
                Curl_printable_address(h->addr,myhost,0x100);
                if ((((data->set).field_0x897 & 0x40) != 0) &&
                   ((pcVar19 = (data->state).feat, pcVar19 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar19->log_level)))) {
                  Curl_infof(data,"Name \'%s\' family %i resolved to \'%s\' family %i",pcVar22,
                             (ulong)uVar10,myhost,(ulong)uVar12);
                }
                Curl_resolv_unlink(data,&h);
                if (uVar12 == uVar10) goto LAB_00117a45;
LAB_00117994:
                iVar14 = IF2IP_AF_NOT_SUPPORTED;
                goto LAB_001179ea;
              }
LAB_001179a2:
              puVar1 = &(data->state).field_0x7be;
              *puVar1 = *puVar1 & 0xdf;
              puVar18 = (uint *)__errno_location();
              uVar10 = *puVar18;
              (data->state).os_errno = uVar10;
              pcVar21 = Curl_strerror(uVar10,(char *)&onoff,0x100);
              pcVar22 = "Couldn\'t bind to \'%s\' with errno %d: %s";
            }
            Curl_failf(data,pcVar22,local_2e8,(ulong)uVar10,pcVar21);
LAB_001179e7:
            iVar14 = 0x2d;
          }
          else {
            iVar14 = 0x2b;
          }
LAB_001179ea:
          iVar9 = 7;
          if (iVar14 != IF2IP_AF_NOT_SUPPORTED) {
            iVar9 = iVar14;
          }
          goto LAB_00117187;
        }
      }
LAB_001177c6:
      if ((data->set).fopensocket != (curl_opensocket_callback)0x0) {
        iVar11 = curlx_nonblock(*sockfd,1);
        if (iVar11 < 0) {
          piVar16 = __errno_location();
          *(int *)((long)pvVar3 + 0x130) = *piVar16;
          iVar9 = IF2IP_AF_NOT_SUPPORTED;
          goto LAB_00117187;
        }
      }
      *(byte *)((long)pvVar3 + 0x134) =
           *(byte *)((long)pvVar3 + 0x134) & 0xf7 | (*(int *)((long)pvVar3 + 0xc) != 2) << 3;
      iVar9 = IF2IP_NOT_FOUND;
      if (bVar6) {
        set_local_ip(cf,data);
        cVar25 = Curl_now();
        *(time_t *)((long)pvVar3 + 0x110) = cVar25.tv_sec;
        *(int *)((long)pvVar3 + 0x118) = cVar25.tv_usec;
        cf->field_0x24 = cf->field_0x24 | 1;
      }
      goto LAB_001171a2;
    }
    puVar18 = (uint *)__errno_location();
    uVar10 = *puVar18;
    *(uint *)((long)pvVar4 + 0x130) = uVar10;
    pcVar21 = Curl_strerror(uVar10,myhost,0x100);
    Curl_failf(data,"curl_sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar10,pcVar21);
    iVar9 = IF2IP_FOUND;
  }
LAB_00117187:
  if (*sockfd != 0xffffffff) {
    socket_close(data,cf->conn,1,*sockfd);
    *sockfd = 0xffffffff;
  }
LAB_001171a2:
  if (((data->set).field_0x897 & 0x40) != 0) {
    pcVar19 = (data->state).feat;
    if (pcVar19 == (curl_trc_feat *)0x0) {
      if (cf == (Curl_cfilter *)0x0) {
        return iVar9;
      }
    }
    else {
      if (cf == (Curl_cfilter *)0x0) {
        return iVar9;
      }
      if (pcVar19->log_level < 1) {
        return iVar9;
      }
    }
    if (0 < cf->cft->log_level) {
      Curl_trc_cf_infof(data,cf,"cf_socket_open() -> %d, fd=%d",(ulong)iVar9,(ulong)*sockfd);
    }
  }
  return iVar9;
}

Assistant:

static CURLcode cf_socket_open(struct Curl_cfilter *cf,
                              struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  int error = 0;
  bool isconnected = FALSE;
  CURLcode result = CURLE_COULDNT_CONNECT;
  bool is_tcp;

  (void)data;
  DEBUGASSERT(ctx->sock == CURL_SOCKET_BAD);
  ctx->started_at = Curl_now();
#ifdef SOCK_NONBLOCK
  /* Do not tuck SOCK_NONBLOCK into socktype when opensocket callback is set
   * because we would not know how socketype is about to be used in the
   * callback, SOCK_NONBLOCK might get factored out before calling socket().
   */
  if(!data->set.fopensocket)
    ctx->addr.socktype |= SOCK_NONBLOCK;
#endif
  result = socket_open(data, &ctx->addr, &ctx->sock);
#ifdef SOCK_NONBLOCK
  /* Restore the socktype after the socket is created. */
  if(!data->set.fopensocket)
    ctx->addr.socktype &= ~SOCK_NONBLOCK;
#endif
  if(result)
    goto out;

  result = set_remote_ip(cf, data);
  if(result)
    goto out;

#ifdef USE_IPV6
  if(ctx->addr.family == AF_INET6) {
    set_ipv6_v6only(ctx->sock, 0);
    infof(data, "  Trying [%s]:%d...", ctx->ip.remote_ip, ctx->ip.remote_port);
  }
  else
#endif
    infof(data, "  Trying %s:%d...", ctx->ip.remote_ip, ctx->ip.remote_port);

#ifdef USE_IPV6
  is_tcp = (ctx->addr.family == AF_INET
            || ctx->addr.family == AF_INET6) &&
           ctx->addr.socktype == SOCK_STREAM;
#else
  is_tcp = (ctx->addr.family == AF_INET) &&
           ctx->addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(data, ctx->sock);

  nosigpipe(data, ctx->sock);

  Curl_sndbuf_init(ctx->sock);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, ctx->sock);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, TRUE);
    error = data->set.fsockopt(data->set.sockopt_client,
                               ctx->sock,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, FALSE);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      result = CURLE_ABORTED_BY_CALLBACK;
      goto out;
    }
  }

#ifndef CURL_DISABLE_BINDLOCAL
  /* possibly bind the local end to an IP, interface or port */
  if(ctx->addr.family == AF_INET
#ifdef USE_IPV6
     || ctx->addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(data, cf->conn, ctx->sock, ctx->addr.family,
                       Curl_ipv6_scope(&ctx->addr.curl_sa_addr));
    if(result) {
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        result = CURLE_COULDNT_CONNECT;
      }
      goto out;
    }
  }
#endif

#ifndef SOCK_NONBLOCK
  /* Set socket non-blocking, must be a non-blocking socket for
   * a non-blocking connect. */
  error = curlx_nonblock(ctx->sock, TRUE);
  if(error < 0) {
    result = CURLE_UNSUPPORTED_PROTOCOL;
    ctx->error = SOCKERRNO;
    goto out;
  }
#else
  if(data->set.fopensocket) {
    /* Set socket non-blocking, must be a non-blocking socket for
     * a non-blocking connect. */
    error = curlx_nonblock(ctx->sock, TRUE);
    if(error < 0) {
      result = CURLE_UNSUPPORTED_PROTOCOL;
      ctx->error = SOCKERRNO;
      goto out;
    }
  }
#endif
  ctx->sock_connected = (ctx->addr.socktype != SOCK_DGRAM);
out:
  if(result) {
    if(ctx->sock != CURL_SOCKET_BAD) {
      socket_close(data, cf->conn, TRUE, ctx->sock);
      ctx->sock = CURL_SOCKET_BAD;
    }
  }
  else if(isconnected) {
    set_local_ip(cf, data);
    ctx->connected_at = Curl_now();
    cf->connected = TRUE;
  }
  CURL_TRC_CF(data, cf, "cf_socket_open() -> %d, fd=%" FMT_SOCKET_T,
              result, ctx->sock);
  return result;
}